

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Minisat::IntOption::printOptionCall(IntOption *this,stringstream *s)

{
  char *__s;
  size_t sVar1;
  ostream *this_00;
  
  this_00 = (ostream *)(s + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"-",1);
  __s = (this->super_Option).name;
  if (__s == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"=",1);
  std::ostream::operator<<((ostream *)this_00,this->value);
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s) { s << "-" << name << "=" << value; }